

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

SourceCodeInfo * __thiscall
google::protobuf::FileDescriptorProto::_internal_mutable_source_code_info(FileDescriptorProto *this)

{
  Arena *arena;
  SourceCodeInfo *pSVar1;
  SourceCodeInfo *p;
  FileDescriptorProto *this_local;
  
  if ((this->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pSVar1 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(arena);
    (this->field_0)._impl_.source_code_info_ = pSVar1;
  }
  return (this->field_0)._impl_.source_code_info_;
}

Assistant:

inline ::google::protobuf::SourceCodeInfo* PROTOBUF_NONNULL FileDescriptorProto::_internal_mutable_source_code_info() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.source_code_info_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::SourceCodeInfo>(GetArena());
    _impl_.source_code_info_ = reinterpret_cast<::google::protobuf::SourceCodeInfo*>(p);
  }
  return _impl_.source_code_info_;
}